

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

Dar_Cut_t * Dar_CutFindFree(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  int local_34;
  Dar_Cut_t *pDStack_30;
  int i;
  Dar_Cut_t *pCutMax;
  Dar_Cut_t *pCut;
  Aig_Obj_t *pObj_local;
  Dar_Man_t *p_local;
  
  pDStack_30 = (Dar_Cut_t *)0x0;
  pCutMax = Dar_ObjCuts(pObj);
  for (local_34 = 0; local_34 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38);
      local_34 = local_34 + 1) {
    if ((*(uint *)&pCutMax->field_0x4 >> 0x1c & 1) == 0) {
      return pCutMax;
    }
    if ((2 < *(uint *)&pCutMax->field_0x4 >> 0x1d) &&
       ((pDStack_30 == (Dar_Cut_t *)0x0 ||
        ((*(uint *)&pCutMax->field_0x4 >> 0x10 & 0x7ff) <
         (*(uint *)&pDStack_30->field_0x4 >> 0x10 & 0x7ff))))) {
      pDStack_30 = pCutMax;
    }
    pCutMax = pCutMax + 1;
  }
  if (pDStack_30 == (Dar_Cut_t *)0x0) {
    pCutMax = Dar_ObjCuts(pObj);
    for (local_34 = 0; local_34 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38)
        ; local_34 = local_34 + 1) {
      if ((1 < *(uint *)&pCutMax->field_0x4 >> 0x1d) &&
         ((pDStack_30 == (Dar_Cut_t *)0x0 ||
          ((*(uint *)&pCutMax->field_0x4 >> 0x10 & 0x7ff) <
           (*(uint *)&pDStack_30->field_0x4 >> 0x10 & 0x7ff))))) {
        pDStack_30 = pCutMax;
      }
      pCutMax = pCutMax + 1;
    }
  }
  if (pDStack_30 == (Dar_Cut_t *)0x0) {
    pCutMax = Dar_ObjCuts(pObj);
    for (local_34 = 0; local_34 < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38)
        ; local_34 = local_34 + 1) {
      if ((pDStack_30 == (Dar_Cut_t *)0x0) ||
         ((*(uint *)&pCutMax->field_0x4 >> 0x10 & 0x7ff) <
          (*(uint *)&pDStack_30->field_0x4 >> 0x10 & 0x7ff))) {
        pDStack_30 = pCutMax;
      }
      pCutMax = pCutMax + 1;
    }
  }
  if (pDStack_30 != (Dar_Cut_t *)0x0) {
    *(uint *)&pDStack_30->field_0x4 = *(uint *)&pDStack_30->field_0x4 & 0xefffffff;
    return pDStack_30;
  }
  __assert_fail("pCutMax != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darCut.c"
                ,0xae,"Dar_Cut_t *Dar_CutFindFree(Dar_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline Dar_Cut_t * Dar_CutFindFree( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCut, * pCutMax;
    int i;
    pCutMax = NULL;
    Dar_ObjForEachCutAll( pObj, pCut, i )
    {
        if ( pCut->fUsed == 0 )
            return pCut;
        if ( pCut->nLeaves < 3 )
            continue;
        if ( pCutMax == NULL || pCutMax->Value > pCut->Value )
            pCutMax = pCut;
    }
    if ( pCutMax == NULL )
    {
        Dar_ObjForEachCutAll( pObj, pCut, i )
        {
            if ( pCut->nLeaves < 2 )
                continue;
            if ( pCutMax == NULL || pCutMax->Value > pCut->Value )
                pCutMax = pCut;
        }
    }
    if ( pCutMax == NULL )
    {
        Dar_ObjForEachCutAll( pObj, pCut, i )
        {
            if ( pCutMax == NULL || pCutMax->Value > pCut->Value )
                pCutMax = pCut;
        }
    }
    assert( pCutMax != NULL );
    pCutMax->fUsed = 0;
    return pCutMax;
}